

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bfba::ktxTexture2_MetadataTest_LibVersionUpdatedCorrectly_Test::TestBody
          (ktxTexture2_MetadataTest_LibVersionUpdatedCorrectly_Test *this)

{
  ktx_uint8_t *pkVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  char *in_R9;
  bool bVar5;
  ktx_error_code_e result;
  ktx_size_t newMemFileLen;
  string writer;
  string curWriter;
  ktxTexture2 *texture;
  ktx_uint8_t *newMemFile;
  ktx_uint8_t *newWriterVal;
  ktx_uint32_t newWriterLen;
  ktx_uint32_t curWriterLen;
  ktx_uint8_t *curWriterVal;
  AssertHelper local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  AssertHelper local_d0;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  AssertHelper local_a8;
  ktx_error_code_e local_9c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  long local_80 [2];
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  AssertHelper local_48;
  AssertHelper local_40;
  int local_38;
  int local_34;
  long local_30;
  
  pkVar1 = (this->super_ktxTexture2_MetadataTest).
           super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
           super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.ktxMemFile;
  if (pkVar1 == (ktx_uint8_t *)0x0) {
    return;
  }
  local_9c = ktxTexture2_CreateFromMemory
                       (pkVar1,(this->super_ktxTexture2_MetadataTest).
                               super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
                               super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.ktxMemFileLen,1,
                        &local_50);
  local_90._M_head_impl._0_1_ = local_9c == KTX_SUCCESS;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_9c != KTX_SUCCESS) {
    testing::Message::Message((Message *)local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_90,(AssertionResult *)"result == KTX_SUCCESS",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0xabf,(char *)local_70);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_c8);
LAB_0013cfc0:
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_70 != (undefined1  [8])&local_60) {
      operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_c8._1_7_,local_c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_c8._1_7_,local_c8[0]) + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    return;
  }
  local_90._M_head_impl._0_1_ = local_50 != 0;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_50 == 0) {
    testing::Message::Message((Message *)local_c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT71(local_c8._1_7_,local_c8[0]) + 0x10),
               "ktxTexture_CreateFromMemory failed: ",0x24);
    pcVar4 = (char *)ktxErrorString(local_9c);
    lVar2 = CONCAT71(local_c8._1_7_,local_c8[0]);
    if (pcVar4 == (char *)0x0) {
      sVar3 = 6;
      pcVar4 = "(null)";
    }
    else {
      sVar3 = strlen(pcVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar2 + 0x10),pcVar4,sVar3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_90,(AssertionResult *)0x17796e,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0xac0,(char *)local_70);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_c8);
    goto LAB_0013cfc0;
  }
  bVar5 = *(long *)(local_50 + 0x70) == 0;
  local_90._M_head_impl._0_1_ = !bVar5;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)local_c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT71(local_c8._1_7_,local_c8[0]) + 0x10),"Image data not loaded",0x15
              );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_90,
               (AssertionResult *)"texture->pData != __null","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0xac2,(char *)local_70);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_c8);
    goto LAB_0013cfc0;
  }
  local_9c = ktxHashList_FindValue(local_50 + 0x50,"KTXwriter",&local_34,&local_30);
  local_90._M_head_impl = local_90._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
            ((internal *)local_70,"result","KTX_SUCCESS",&local_9c,(ktx_error_code_e *)&local_90);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0xac9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  bVar5 = *(char *)(local_30 + (ulong)(local_34 - 1)) == '\0';
  local_90._M_head_impl._0_1_ = bVar5;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)local_c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(CONCAT71(local_c8._1_7_,local_c8[0]) + 0x10),
               "KTXwriter not NUL terminated",0x1c);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_90,
               (AssertionResult *)"curWriterVal[curWriterLen-1] == \'\\0\'","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0xacc,(char *)local_70);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_c8);
    goto LAB_0013cfc0;
  }
  local_70 = (undefined1  [8])&local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,local_30,(ulong)(local_34 - 1) + local_30);
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_70,(char *)((long)local_70 + (long)&local_68->_M_dataplus));
  lVar2 = std::__cxx11::string::rfind((char)&local_90,0x2f);
  local_e0.data_._0_4_ = CONCAT31(local_e0.data_._1_3_,lVar2 != -1);
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (lVar2 == -1) {
    testing::Message::Message((Message *)&local_98);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_98._M_head_impl + 0x10),"KTXwriter does not have lib version.",0x24
              );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)&local_e0,
               (AssertionResult *)"slash_pos != std::string::npos","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0xad3,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::replace((ulong)&local_90,lVar2 + 2,(char *)0xffffffffffffffff,0x17862b);
    local_9c = ktxHashList_AddKVPair
                         (local_50 + 0x50,"KTXwriter",(ulong)local_88 & 0xffffffff,
                          local_90._M_head_impl);
    local_e0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)local_c8,"result","KTX_SUCCESS",&local_9c,(ktx_error_code_e *)&local_e0);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_e0);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0xada,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
      if ((long *)CONCAT44(local_e0.data_._4_4_,local_e0.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,local_e0.data_._0_4_) + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_9c = (**(code **)(*(long *)(local_50 + 8) + 0x68))(local_50,&local_48,&local_98);
    local_e0.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)local_c8,"result","KTX_SUCCESS",&local_9c,(ktx_error_code_e *)&local_e0);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_e0);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0xae2,pcVar4);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if ((long *)CONCAT44(local_e0.data_._4_4_,local_e0.data_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,local_e0.data_._0_4_) + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    if (local_50 != 0) {
      (*(code *)**(undefined8 **)(local_50 + 8))();
    }
    local_9c = ktxTexture2_CreateFromMemory(local_48.data_,local_98._M_head_impl,1,&local_50);
    local_e0.data_._0_4_ = CONCAT31(local_e0.data_._1_3_,local_9c == KTX_SUCCESS);
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_9c == KTX_SUCCESS) {
      local_e0.data_._0_4_ = CONCAT31(local_e0.data_._1_3_,local_50 != 0);
      local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_50 == 0) {
        testing::Message::Message((Message *)&local_d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 0x10),
                   "ktxTexture_CreateFromMemory failed: ",0x24);
        pcVar4 = (char *)ktxErrorString(local_9c);
        lVar2 = CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_);
        if (pcVar4 == (char *)0x0) {
          sVar3 = 6;
          pcVar4 = "(null)";
        }
        else {
          sVar3 = strlen(pcVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar2 + 0x10),pcVar4,sVar3);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_c8,(internal *)&local_e0,(AssertionResult *)0x17796e,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0xaee,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_d0);
      }
      else {
        bVar5 = *(long *)(local_50 + 0x70) == 0;
        local_e0.data_._0_4_ = CONCAT31(local_e0.data_._1_3_,!bVar5);
        local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar5) {
          testing::Message::Message((Message *)&local_d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 0x10),
                     "Image data not loaded",0x15);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_c8,(internal *)&local_e0,
                     (AssertionResult *)"texture->pData != __null","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0xaf0,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_d0);
        }
        else {
          local_9c = ktxHashList_FindValue(local_50 + 0x50,"KTXwriter",&local_38,&local_40);
          local_e0.data_._0_4_ = 0;
          testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
                    ((internal *)local_c8,"result","KTX_SUCCESS",&local_9c,
                     (ktx_error_code_e *)&local_e0);
          if (local_c8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_e0);
            if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar4 = "";
            }
            else {
              pcVar4 = (local_c0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_d0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                       ,0xaf5,pcVar4);
            testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e0);
            testing::internal::AssertHelper::~AssertHelper(&local_d0);
            if ((long *)CONCAT44(local_e0.data_._4_4_,local_e0.data_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,local_e0.data_._0_4_) + 8))();
            }
          }
          if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_c0,local_c0);
          }
          bVar5 = *(char *)((long)&(local_40.data_)->type + (ulong)(local_38 - 1)) == '\0';
          local_e0.data_._0_4_ = CONCAT31(local_e0.data_._1_3_,bVar5);
          local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar5) {
            local_e0.data_._0_4_ = 0;
            local_d0.data_._0_4_ = std::__cxx11::string::compare(local_70);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_c8,"0","curWriter.compare((char *)newWriterVal)",
                       (int *)&local_e0,(int *)&local_d0);
            if (local_c8[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_e0);
              if (local_c0 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_c0->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_d0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                         ,0xaf9,pcVar4);
              testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e0);
              testing::internal::AssertHelper::~AssertHelper(&local_d0);
              if ((long *)CONCAT44(local_e0.data_._4_4_,local_e0.data_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_e0.data_._4_4_,local_e0.data_._0_4_) + 8))();
              }
            }
            if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_c0,local_c0);
            }
            if (local_50 != 0) {
              (*(code *)**(undefined8 **)(local_50 + 8))();
            }
            if (local_48.data_ != (AssertHelperData *)0x0) {
              free(local_48.data_);
            }
            goto LAB_0013d704;
          }
          testing::Message::Message((Message *)&local_d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_) + 0x10),
                     "KTXwriter not NUL terminated",0x1c);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_c8,(internal *)&local_e0,
                     (AssertionResult *)"newWriterVal[newWriterLen-1] == \'\\0\'","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0xaf6,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
          testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_d0);
        }
      }
    }
    else {
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c8,(internal *)&local_e0,(AssertionResult *)"result == KTX_SUCCESS"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0xaed,(char *)CONCAT71(local_c8._1_7_,local_c8[0]));
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_d0);
    }
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_c8._1_7_,local_c8[0]) != &local_b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_c8._1_7_,local_c8[0]),local_b8._M_allocated_capacity + 1);
    }
    local_98._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(local_d0.data_._4_4_,local_d0.data_._0_4_);
  }
  if (local_98._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_98._M_head_impl + 8))();
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
LAB_0013d704:
  if (local_90._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80) {
    operator_delete(local_90._M_head_impl,local_80[0] + 1);
  }
  if (local_70 == (undefined1  [8])&local_60) {
    return;
  }
  operator_delete((void *)local_70,local_60._M_allocated_capacity + 1);
  return;
}

Assistant:

TEST_F(ktxTexture2_MetadataTest, LibVersionUpdatedCorrectly) {
    ktxTexture2* texture;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture2_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                              KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                              &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image data not loaded";

        ktx_uint32_t curWriterLen;
        ktx_uint8_t* curWriterVal;
        result = ktxHashList_FindValue(&texture->kvDataHead,
                                       "KTXwriter",
                                        &curWriterLen, (void**)&curWriterVal);
        EXPECT_EQ(result, KTX_SUCCESS);
        // We want ktxWriteTo* to NUL terminate the value when adding
        // the libktx version.
        ASSERT_TRUE(curWriterVal[curWriterLen-1] == '\0')
                    << "KTXwriter not NUL terminated";
        // The pointer returned by FindValue becomes invalid when the texture
        // is destroyed hence saving to this string. -1 to omit the terminator.
        std::string curWriter((char*)curWriterVal, curWriterLen-1);
        std::string writer(curWriter);
        size_t slash_pos = writer.find_last_of('/');
        ASSERT_TRUE(slash_pos != std::string::npos)
                    << "KTXwriter does not have lib version.";
        writer.replace(slash_pos + 2, std::string::npos, "libktx v3.0.0");
        result = ktxHashList_AddKVPair(&texture->kvDataHead,
                                       "KTXwriter",
                                       (ktx_uint32_t)writer.length(),
                                       writer.c_str());
        EXPECT_EQ(result, KTX_SUCCESS);


        ktx_size_t newMemFileLen;
        ktx_uint8_t* newMemFile;
        result = ktxTexture_WriteToMemory(ktxTexture(texture),
                                          &newMemFile,
                                          &newMemFileLen);
        EXPECT_EQ(result, KTX_SUCCESS);

        if (texture)
            ktxTexture_Destroy(ktxTexture(texture));

        ktx_uint32_t newWriterLen;
        ktx_uint8_t* newWriterVal;
        result = ktxTexture2_CreateFromMemory(newMemFile,
                                              newMemFileLen,
                                              KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                              &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image data not loaded";

        result = ktxHashList_FindValue(&texture->kvDataHead,
                                       "KTXwriter",
                                        &newWriterLen, (void**)&newWriterVal);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(newWriterVal[newWriterLen-1] == '\0')
                    << "KTXwriter not NUL terminated";

        EXPECT_EQ(0, curWriter.compare((char *)newWriterVal));

        if (texture)
            ktxTexture_Destroy(ktxTexture(texture));

        if (newMemFile)
            free(newMemFile);
    }
}